

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_binary_arith_slow(JSContext *ctx,JSValue *sp,OPCodeEnum op)

{
  JSValue *pJVar1;
  double dVar2;
  int *piVar3;
  JSValue val;
  JSValue v;
  int iVar4;
  uint32_t tag;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t tag_1;
  uint uVar9;
  JSRefCountHeader *p;
  anon_union_8_2_94730072 u;
  double d2;
  double d1;
  int *local_38;
  double local_30;
  
  dVar2 = sp[-2].u.float64;
  pJVar1 = sp + -1;
  piVar3 = (int *)(pJVar1->u).float64;
  v = *pJVar1;
  val = *pJVar1;
  uVar5 = (uint)sp[-2].tag;
  uVar9 = (uint)sp[-1].tag;
  if (uVar5 < 3) {
    dVar2 = (double)SUB84(dVar2,0);
LAB_00138663:
    local_30 = dVar2;
    if (uVar9 < 3) {
      piVar3 = (int *)(double)(int)piVar3;
    }
    else if ((uVar9 != 7) &&
            (iVar4 = __JS_ToFloat64Free(ctx,(double *)&local_38,val), piVar3 = local_38, iVar4 != 0)
            ) goto LAB_00138798;
    local_38 = piVar3;
    switch(op) {
    case OP_mul:
      local_30 = local_30 * (double)local_38;
      break;
    case OP_div:
      local_30 = local_30 / (double)local_38;
      break;
    case OP_mod:
      local_30 = fmod(local_30,(double)local_38);
      break;
    default:
      abort();
    case OP_sub:
      local_30 = local_30 - (double)local_38;
      break;
    case OP_pow:
      if (((((ulong)local_38 & 0x7fffffffffffffff) < 0x7ff0000000000000) || (ABS(local_30) != 1.0))
         || (NAN(ABS(local_30)))) {
        local_30 = pow(local_30,(double)local_38);
      }
      else {
        local_30 = NAN;
      }
    }
    iVar4 = 0;
    uVar7 = (ulong)local_30 & 0xffffffff;
    uVar8 = (ulong)local_30 & 0xffffffff00000000;
    if (local_30 == (double)(int)local_30) {
      uVar7 = (ulong)(uint)(int)local_30;
      uVar8 = 0;
    }
    uVar6 = 7;
    if (local_30 == (double)(int)local_30) {
      uVar6 = 0;
    }
    sp[-2].u.ptr = (void *)(uVar7 | uVar8);
    sp[-2].tag = uVar6;
  }
  else {
    if ((uVar5 == 7) ||
       (iVar4 = __JS_ToFloat64Free(ctx,&local_30,sp[-2]), dVar2 = local_30, iVar4 == 0))
    goto LAB_00138663;
    if ((0xfffffff4 < uVar9) && (iVar4 = *piVar3, *piVar3 = iVar4 + -1, iVar4 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
LAB_00138798:
    sp[-2].u.int32 = 0;
    sp[-2].tag = 3;
    sp[-1].u.int32 = 0;
    sp[-1].tag = 3;
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int js_binary_arith_slow(JSContext *ctx, JSValue *sp,
                                                      OPCodeEnum op)
{
    JSValue op1, op2;
    double d1, d2, r;

    op1 = sp[-2];
    op2 = sp[-1];
    if (unlikely(JS_ToFloat64Free(ctx, &d1, op1))) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    if (unlikely(JS_ToFloat64Free(ctx, &d2, op2))) {
        goto exception;
    }
    switch(op) {
    case OP_sub:
        r = d1 - d2;
        break;
    case OP_mul:
        r = d1 * d2;
        break;
    case OP_div:
        r = d1 / d2;
        break;
    case OP_mod:
        r = fmod(d1, d2);
        break;
    case OP_pow:
        r = js_pow(d1, d2);
        break;
    default:
        abort();
    }
    sp[-2] = JS_NewFloat64(ctx, r);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}